

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

ImageViewWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateImageView
          (ImageViewWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkImageViewCreateInfo *ImageViewCI,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkImageViewCreateInfo *ImageViewCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (ImageViewCI->sType != VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO) {
    Diligent::FormatString<char[26],char[62]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageViewCI.sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO",
               (char (*) [62])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xd4);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkImageView_T*,(VulkanUtilities::VulkanHandleTypeId)5,VkResult(*)(VkDevice_T*,VkImageViewCreateInfo_const*,VkAllocationCallbacks_const*,VkImageView_T**),VkImageViewCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkImageViewCreateInfo_ptr_VkAllocationCallbacks_ptr_VkImageView_T_ptr_ptr
              *)vkCreateImageView,ImageViewCI,(char *)msg.field_2._8_8_,"image view");
  return __return_storage_ptr__;
}

Assistant:

ImageViewWrapper VulkanLogicalDevice::CreateImageView(const VkImageViewCreateInfo& ImageViewCI,
                                                      const char*                  DebugName) const
{
    VERIFY_EXPR(ImageViewCI.sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO);
    return CreateVulkanObject<VkImageView, VulkanHandleTypeId::ImageView>(vkCreateImageView, ImageViewCI, DebugName, "image view");
}